

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createMiscDrawTests(TestContext *testCtx)

{
  TessPrimitiveType TVar1;
  TestCaseGroup *pTVar2;
  ulong uVar3;
  char *pcVar4;
  SpacingMode SVar5;
  CaseDefinition *in_R9;
  undefined **local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string caseName;
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,testCtx,"misc_draw","Miscellaneous draw-result-verifying cases");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar2;
  for (uVar3 = 0; uVar3 != 2; uVar3 = uVar3 + 1) {
    TVar1 = createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[uVar3];
    local_170 = &PTR_anon_var_dwarf_fa11a3_00bdb2c8;
    for (SVar5 = SPACINGMODE_EQUAL; SVar5 != SPACINGMODE_LAST;
        SVar5 = SVar5 + SPACINGMODE_FRACTIONAL_ODD) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_108,&local_138,"fill_cover_");
      if ((uVar3 & 0x3ffffffffffffffe) == 0) {
        pcVar4 = *(char **)(&DAT_00bdb2b0 + (long)(int)TVar1 * 8);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      std::operator+(&local_158,&local_108,pcVar4);
      std::operator+(&local_e8,&local_158,"_");
      std::operator+(&caseName,&local_e8,*local_170);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_138);
      pTVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,
                 "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape"
                 ,(allocator<char> *)&local_108);
      anon_unknown_2::getReferenceImagePathPrefix(&local_158,&caseName);
      anon_unknown_2::makeCaseDefinition((CaseDefinition *)local_58,TVar1,SVar5,&local_158);
      addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                (pTVar2,&caseName,&local_e8,anon_unknown_2::initProgramsFillCoverCase,
                 (Function)local_58,in_R9);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&caseName);
      local_170 = local_170 + 1;
    }
  }
  for (uVar3 = 0; uVar3 != 2; uVar3 = uVar3 + 1) {
    TVar1 = createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[uVar3];
    local_170 = &PTR_anon_var_dwarf_fa11a3_00bdb2c8;
    for (SVar5 = SPACINGMODE_EQUAL; SVar5 != SPACINGMODE_LAST;
        SVar5 = SVar5 + SPACINGMODE_FRACTIONAL_ODD) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_108,&local_138,"fill_overlap_");
      if ((uVar3 & 0x3ffffffffffffffe) == 0) {
        pcVar4 = *(char **)(&DAT_00bdb2b0 + (long)(int)TVar1 * 8);
      }
      else {
        pcVar4 = (char *)0x0;
      }
      std::operator+(&local_158,&local_108,pcVar4);
      std::operator+(&local_e8,&local_158,"_");
      std::operator+(&caseName,&local_e8,*local_170);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_138);
      pTVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,
                 "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape"
                 ,(allocator<char> *)&local_108);
      anon_unknown_2::getReferenceImagePathPrefix(&local_158,&caseName);
      anon_unknown_2::makeCaseDefinition((CaseDefinition *)local_80,TVar1,SVar5,&local_158);
      addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                (pTVar2,&caseName,&local_e8,anon_unknown_2::initProgramsFillNonOverlapCase,
                 (Function)local_80,in_R9);
      std::__cxx11::string::~string((string *)(local_80 + 8));
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&caseName);
      local_170 = local_170 + 1;
    }
  }
  local_170 = &PTR_anon_var_dwarf_fa11a3_00bdb2c8;
  for (SVar5 = SPACINGMODE_EQUAL;
      pTVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, SVar5 != SPACINGMODE_LAST; SVar5 = SVar5 + SPACINGMODE_FRACTIONAL_ODD) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_e8,&local_158,"isolines_");
    std::operator+(&caseName,&local_e8,*local_170);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_158);
    pTVar2 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
             m_data.ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Basic isolines render test",(allocator<char> *)&local_108);
    anon_unknown_2::getReferenceImagePathPrefix(&local_158,&caseName);
    anon_unknown_2::makeCaseDefinition
              ((CaseDefinition *)local_a8,TESSPRIMITIVETYPE_ISOLINES,SVar5,&local_158);
    addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
              (pTVar2,&caseName,&local_e8,anon_unknown_2::initProgramsIsolinesCase,
               (Function)local_a8,in_R9);
    std::__cxx11::string::~string((string *)(local_a8 + 8));
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&caseName);
    local_170 = local_170 + 1;
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createMiscDrawTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "misc_draw", "Miscellaneous draw-result-verifying cases"));

	static const TessPrimitiveType primitivesNoIsolines[] =
	{
		TESSPRIMITIVETYPE_TRIANGLES,
		TESSPRIMITIVETYPE_QUADS,
	};

	// Triangle fill case
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitivesNoIsolines); ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitivesNoIsolines[primitiveTypeNdx];
		const SpacingMode		spacingMode	  = static_cast<SpacingMode>(spacingModeNdx);
		const std::string		caseName	  = std::string() + "fill_cover_" + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape",
									initProgramsFillCoverCase, runTest, makeCaseDefinition(primitiveType, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	// Triangle non-overlap case
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitivesNoIsolines); ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitivesNoIsolines[primitiveTypeNdx];
		const SpacingMode		spacingMode	  = static_cast<SpacingMode>(spacingModeNdx);
		const std::string		caseName	  = std::string() + "fill_overlap_" + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape",
									initProgramsFillNonOverlapCase, runTest, makeCaseDefinition(primitiveType, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	// Isolines
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const SpacingMode spacingMode = static_cast<SpacingMode>(spacingModeNdx);
		const std::string caseName    = std::string() + "isolines_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Basic isolines render test",
									initProgramsIsolinesCase, runTest, makeCaseDefinition(TESSPRIMITIVETYPE_ISOLINES, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	return group.release();
}